

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

csubstr __thiscall c4::yml::Parser::_slurp_doc_scalar(Parser *this)

{
  State *pSVar1;
  ulong uVar2;
  code *pcVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  size_t sVar7;
  size_t sVar8;
  long in_RCX;
  long lVar9;
  ulong uVar10;
  long lVar11;
  char *pcVar12;
  char *pcVar13;
  ulong uVar14;
  bool bVar15;
  byte bVar16;
  ro_substr chars;
  ro_substr chars_00;
  csubstr cVar17;
  char msg [73];
  csubstr local_128;
  long local_118;
  size_t local_110;
  Parser *local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  char *pcStack_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  char *pcStack_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  char *pcStack_98;
  undefined8 local_90;
  char local_88 [72];
  undefined1 local_40;
  
  bVar16 = 0;
  pSVar1 = this->m_state;
  local_128 = (pSVar1->line_contents).rem;
  sVar8 = (pSVar1->pos).super_LineCol.offset;
  uVar2 = (pSVar1->line_contents).full.len;
  if ((2 < uVar2) && (uVar2 != 2)) {
    lVar11 = 0;
    local_110 = sVar8;
    local_108 = this;
    do {
      bVar15 = true;
      uVar10 = 0;
      lVar9 = in_RCX;
      do {
        if ((pSVar1->line_contents).full.len <= uVar10 + lVar11) {
          local_118 = lVar9;
          _slurp_doc_scalar();
          lVar9 = local_118;
        }
        in_RCX = lVar9;
        if ((pSVar1->line_contents).full.str[uVar10 + lVar11] != "---"[uVar10]) break;
        bVar15 = uVar10 < 2;
        uVar10 = uVar10 + 1;
        in_RCX = lVar11;
      } while (uVar10 != 3);
      if (!bVar15) goto LAB_001ea501;
      lVar11 = lVar11 + 1;
    } while (lVar11 != uVar2 - 2);
    in_RCX = -1;
LAB_001ea501:
    this = local_108;
    sVar8 = local_110;
    if (in_RCX != -1) goto LAB_001ea5c2;
  }
  pcVar12 = "check failed: (m_state->line_contents.full.find(\"---\") != csubstr::npos)";
  pcVar13 = local_88;
  for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
    *(undefined8 *)pcVar13 = *(undefined8 *)pcVar12;
    pcVar12 = pcVar12 + ((ulong)bVar16 * -2 + 1) * 8;
    pcVar13 = pcVar13 + ((ulong)bVar16 * -2 + 1) * 8;
  }
  local_40 = 0;
  if (((s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
    pcVar3 = (code *)swi(3);
    cVar17 = (csubstr)(*pcVar3)();
    return cVar17;
  }
  local_b0 = 0;
  uStack_a8 = 0x72d4;
  local_a0 = 0;
  pcStack_98 = 
  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
  ;
  local_90 = 0x65;
  LVar4.super_LineCol.col = 0;
  LVar4.super_LineCol.offset = SUB168(ZEXT816(0x72d4) << 0x40,0);
  LVar4.super_LineCol.line = SUB168(ZEXT816(0x72d4) << 0x40,8);
  LVar4.name.str =
       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
  ;
  LVar4.name.len = 0x65;
  (*(this->m_stack).m_callbacks.m_error)
            (local_88,0x49,LVar4,(this->m_stack).m_callbacks.m_user_data);
LAB_001ea5c2:
  if (local_128.len == 0) {
    _line_ended(this);
    _scan_line(this);
    local_128 = (this->m_state->line_contents).rem;
    sVar8 = (this->m_state->pos).super_LineCol.offset;
  }
  chars.len = 2;
  chars.str = " \t";
  sVar7 = basic_substring<const_char>::first_not_of(&local_128,chars,0);
  if (sVar7 != 0xffffffffffffffff) {
    _line_progressed(this,sVar7);
    local_128 = (this->m_state->line_contents).rem;
    sVar8 = (this->m_state->pos).super_LineCol.offset;
  }
  if (((this->m_val_anchor).len != 0) && ((this->m_val_anchor).str != (char *)0x0)) {
    builtin_strncpy(local_88,"check failed: (m_val_anchor.empty())",0x25);
    if (((s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      pcVar3 = (code *)swi(3);
      cVar17 = (csubstr)(*pcVar3)();
      return cVar17;
    }
    local_d8 = 0;
    uStack_d0 = 0x72e8;
    local_c8 = 0;
    pcStack_c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_b8 = 0x65;
    LVar5.super_LineCol.col = 0;
    LVar5.super_LineCol.offset = SUB168(ZEXT816(0x72e8) << 0x40,0);
    LVar5.super_LineCol.line = SUB168(ZEXT816(0x72e8) << 0x40,8);
    LVar5.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar5.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_88,0x25,LVar5,(this->m_stack).m_callbacks.m_user_data);
  }
  _handle_val_anchors_and_refs(this);
  if (((this->m_val_anchor).len != 0) && ((this->m_val_anchor).str != (char *)0x0)) {
    local_128 = (this->m_state->line_contents).rem;
    chars_00.len = 2;
    chars_00.str = " \t";
    sVar8 = basic_substring<const_char>::first_not_of(&local_128,chars_00,0);
    if (sVar8 != 0xffffffffffffffff) {
      _line_progressed(this,sVar8);
    }
    local_128 = (this->m_state->line_contents).rem;
    sVar8 = (this->m_state->pos).super_LineCol.offset;
  }
  if (local_128.len != 0) {
    if (*local_128.str == '\'') {
      sVar8 = LineContents::current_col(&this->m_state->line_contents,local_128);
      this->m_state->scalar_col = sVar8;
      cVar17 = _scan_squot_scalar(this);
      return cVar17;
    }
    if (local_128.len != 0) {
      if (*local_128.str == '\"') {
        sVar8 = LineContents::current_col(&this->m_state->line_contents,local_128);
        this->m_state->scalar_col = sVar8;
        cVar17 = _scan_dquot_scalar(this);
        return cVar17;
      }
      if ((local_128.len != 0) &&
         ((*local_128.str == '|' || ((local_128.len != 0 && (*local_128.str == '>')))))) {
        cVar17 = _scan_block(this);
        return cVar17;
      }
    }
  }
  sVar7 = LineContents::current_col(&this->m_state->line_contents,local_128);
  this->m_state->scalar_col = sVar7;
  if (local_128.str + local_128.len < (this->m_buf).str + sVar8) {
    builtin_strncpy(local_88 + 0x10,".end() >= m_buf.begin() + pos)",0x1f);
    builtin_strncpy(local_88,"check failed: (s",0x10);
    if (((s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      pcVar3 = (code *)swi(3);
      cVar17 = (csubstr)(*pcVar3)();
      return cVar17;
    }
    local_100 = 0;
    uStack_f8 = 0x7309;
    local_f0 = 0;
    pcStack_e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_e0 = 0x65;
    LVar6.super_LineCol.col = 0;
    LVar6.super_LineCol.offset = SUB168(ZEXT816(0x7309) << 0x40,0);
    LVar6.super_LineCol.line = SUB168(ZEXT816(0x7309) << 0x40,8);
    LVar6.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar6.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_88,0x2f,LVar6,(this->m_stack).m_callbacks.m_user_data);
  }
  _line_progressed(this,(size_t)(local_128.str + (local_128.len - (long)((this->m_buf).str + sVar8))
                                ));
  pcVar12 = (this->m_state->line_contents).rem.str;
  uVar2 = (this->m_state->line_contents).rem.len;
  if (pcVar12 != (char *)0x0 && uVar2 != 0) {
    if (*pcVar12 != ' ') {
      return local_128;
    }
    uVar10 = 0;
    do {
      uVar14 = uVar2;
      if (uVar2 - 1 == uVar10) break;
      uVar14 = uVar10 + 1;
      lVar11 = uVar10 + 1;
      uVar10 = uVar14;
    } while (pcVar12[lVar11] == ' ');
    if (uVar14 < uVar2) {
      return local_128;
    }
  }
  cVar17 = _extend_scanned_scalar(this,local_128);
  return cVar17;
}

Assistant:

csubstr Parser::_slurp_doc_scalar()
{
    csubstr s = m_state->line_contents.rem;
    size_t pos = m_state->pos.offset;
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->line_contents.full.find("---") != csubstr::npos);
    _c4dbgpf("slurp 0 '{}'. REM='{}'", s, m_buf.sub(m_state->pos.offset));
    if(s.len == 0)
    {
        _line_ended();
        _scan_line();
        s = m_state->line_contents.rem;
        pos = m_state->pos.offset;
    }

    size_t skipws = s.first_not_of(" \t");
    _c4dbgpf("slurp 1 '{}'. REM='{}'", s, m_buf.sub(m_state->pos.offset));
    if(skipws != npos)
    {
        _line_progressed(skipws);
        s = m_state->line_contents.rem;
        pos = m_state->pos.offset;
        _c4dbgpf("slurp 2 '{}'. REM='{}'", s, m_buf.sub(m_state->pos.offset));
    }

    _RYML_CB_ASSERT(m_stack.m_callbacks, m_val_anchor.empty());
    _handle_val_anchors_and_refs();
    if(!m_val_anchor.empty())
    {
        s = m_state->line_contents.rem;
        skipws = s.first_not_of(" \t");
        if(skipws != npos)
        {
            _line_progressed(skipws);
        }
        s = m_state->line_contents.rem;
        pos = m_state->pos.offset;
        _c4dbgpf("slurp 3 '{}'. REM='{}'", s, m_buf.sub(m_state->pos.offset));
    }

    if(s.begins_with('\''))
    {
        m_state->scalar_col = m_state->line_contents.current_col(s);
        return _scan_squot_scalar();
    }
    else if(s.begins_with('"'))
    {
        m_state->scalar_col = m_state->line_contents.current_col(s);
        return _scan_dquot_scalar();
    }
    else if(s.begins_with('|') || s.begins_with('>'))
    {
        return _scan_block();
    }

    _c4dbgpf("slurp 4 '{}'. REM='{}'", s, m_buf.sub(m_state->pos.offset));

    m_state->scalar_col = m_state->line_contents.current_col(s);
    _RYML_CB_ASSERT(m_stack.m_callbacks, s.end() >= m_buf.begin() + pos);
    _line_progressed(static_cast<size_t>(s.end() - (m_buf.begin() + pos)));

    _c4dbgpf("slurp 5 '{}'. REM='{}'", s, m_buf.sub(m_state->pos.offset));

    if(_at_line_end())
    {
        _c4dbgpf("at line end. curr='{}'", s);
        s = _extend_scanned_scalar(s);
    }

    _c4dbgpf("scalar was '{}'", s);

    return s;
}